

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

rect2d __thiscall rengine::rect2d::aligned(rect2d *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  rect2d *this_local;
  
  dVar1 = std::floor((double)(ulong)(uint)(this->tl).x);
  dVar2 = std::floor((double)(ulong)(uint)(this->tl).y);
  dVar3 = std::ceil((double)(ulong)(uint)(this->br).x);
  dVar4 = std::ceil((double)(ulong)(uint)(this->br).y);
  rect2d((rect2d *)&this_local,SUB84(dVar1,0),SUB84(dVar2,0),SUB84(dVar3,0),SUB84(dVar4,0));
  return _this_local;
}

Assistant:

rect2d aligned() const {
        return rect2d(std::floor(tl.x), std::floor(tl.y),
                      std::ceil(br.x), std::ceil(br.y));
    }